

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes.cc
# Opt level: O1

void __thiscall
dynet::AffineTransform::forward_dev_impl<dynet::Device_CPU>
          (AffineTransform *this,Device_CPU *dev,
          vector<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_> *xs,Tensor *fx)

{
  uint uVar1;
  uint uVar2;
  Tensor *pTVar3;
  float *pfVar4;
  Tensor *pTVar5;
  bool bVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined8 uVar9;
  byte bVar10;
  byte bVar11;
  StorageIndex i;
  pointer ppTVar12;
  uint uVar13;
  ulong uVar14;
  uint uVar15;
  ulong uVar16;
  ulong uVar17;
  float *pfVar18;
  long lVar19;
  long lVar20;
  uint uVar21;
  ushort uVar22;
  undefined1 auVar23 [32];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  int iVar37;
  int iVar38;
  Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> local_b8;
  Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> local_98;
  ulong local_78;
  Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> local_70;
  Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> local_50;
  
  ppTVar12 = (xs->super__Vector_base<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_>)
             ._M_impl.super__Vector_impl_data._M_start;
  uVar14 = (long)(xs->
                 super__Vector_base<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_>).
                 _M_impl.super__Vector_impl_data._M_finish - (long)ppTVar12;
  if ((uVar14 & 8) == 0) {
    __assert_fail("xs.size() % 2 == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/trevorcohn[P]mantis/dynet/dynet/nodes.cc"
                  ,0xe6,
                  "void dynet::AffineTransform::forward_dev_impl(const MyDevice &, const vector<const Tensor *> &, Tensor &) const [MyDevice = dynet::Device_CPU]"
                 );
  }
  if (uVar14 == 8) {
    fx->v = (*ppTVar12)->v;
  }
  else {
    uVar13 = (fx->d).bd;
    pTVar3 = *ppTVar12;
    uVar15 = (pTVar3->d).bd;
    if (uVar13 == uVar15) {
      uVar14 = (ulong)(pTVar3->d).nd;
      iVar38 = 1;
      iVar37 = 1;
      if (uVar14 != 0) {
        auVar24 = vpbroadcastq_avx512f();
        auVar25 = vpbroadcastd_avx512f(ZEXT416(1));
        uVar17 = 0;
        auVar26 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
        auVar27 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
        do {
          auVar28 = vmovdqa64_avx512f(auVar25);
          auVar25 = vpbroadcastq_avx512f();
          auVar29 = vporq_avx512f(auVar25,auVar26);
          auVar25 = vporq_avx512f(auVar25,auVar27);
          uVar9 = vpcmpuq_avx512f(auVar25,auVar24,2);
          bVar10 = (byte)uVar9;
          uVar9 = vpcmpuq_avx512f(auVar29,auVar24,2);
          bVar11 = (byte)uVar9;
          uVar22 = CONCAT11(bVar11,bVar10);
          auVar25 = vmovdqu32_avx512f(*(undefined1 (*) [64])((pTVar3->d).d + uVar17));
          auVar29._4_4_ = (uint)((byte)(uVar22 >> 1) & 1) * auVar25._4_4_;
          auVar29._0_4_ = (uint)(bVar10 & 1) * auVar25._0_4_;
          auVar29._8_4_ = (uint)((byte)(uVar22 >> 2) & 1) * auVar25._8_4_;
          auVar29._12_4_ = (uint)((byte)(uVar22 >> 3) & 1) * auVar25._12_4_;
          auVar29._16_4_ = (uint)((byte)(uVar22 >> 4) & 1) * auVar25._16_4_;
          auVar29._20_4_ = (uint)((byte)(uVar22 >> 5) & 1) * auVar25._20_4_;
          auVar29._24_4_ = (uint)((byte)(uVar22 >> 6) & 1) * auVar25._24_4_;
          auVar29._28_4_ = (uint)((byte)(uVar22 >> 7) & 1) * auVar25._28_4_;
          auVar29._32_4_ = (uint)(bVar11 & 1) * auVar25._32_4_;
          auVar29._36_4_ = (uint)(bVar11 >> 1 & 1) * auVar25._36_4_;
          auVar29._40_4_ = (uint)(bVar11 >> 2 & 1) * auVar25._40_4_;
          auVar29._44_4_ = (uint)(bVar11 >> 3 & 1) * auVar25._44_4_;
          auVar29._48_4_ = (uint)(bVar11 >> 4 & 1) * auVar25._48_4_;
          auVar29._52_4_ = (uint)(bVar11 >> 5 & 1) * auVar25._52_4_;
          auVar29._56_4_ = (uint)(bVar11 >> 6 & 1) * auVar25._56_4_;
          auVar29._60_4_ = (uint)(bVar11 >> 7) * auVar25._60_4_;
          auVar25 = vpmulld_avx512f(auVar29,auVar28);
          uVar17 = uVar17 + 0x10;
        } while ((uVar14 + 0xf & 0x1fffffff0) != uVar17);
        auVar24 = vmovdqa32_avx512f(auVar25);
        auVar26._0_4_ =
             (uint)(bVar10 & 1) * auVar24._0_4_ | (uint)!(bool)(bVar10 & 1) * auVar28._0_4_;
        bVar6 = (bool)((byte)(uVar22 >> 1) & 1);
        auVar26._4_4_ = (uint)bVar6 * auVar24._4_4_ | (uint)!bVar6 * auVar28._4_4_;
        bVar6 = (bool)((byte)(uVar22 >> 2) & 1);
        auVar26._8_4_ = (uint)bVar6 * auVar24._8_4_ | (uint)!bVar6 * auVar28._8_4_;
        bVar6 = (bool)((byte)(uVar22 >> 3) & 1);
        auVar26._12_4_ = (uint)bVar6 * auVar24._12_4_ | (uint)!bVar6 * auVar28._12_4_;
        bVar6 = (bool)((byte)(uVar22 >> 4) & 1);
        auVar26._16_4_ = (uint)bVar6 * auVar24._16_4_ | (uint)!bVar6 * auVar28._16_4_;
        bVar6 = (bool)((byte)(uVar22 >> 5) & 1);
        auVar26._20_4_ = (uint)bVar6 * auVar24._20_4_ | (uint)!bVar6 * auVar28._20_4_;
        bVar6 = (bool)((byte)(uVar22 >> 6) & 1);
        auVar26._24_4_ = (uint)bVar6 * auVar24._24_4_ | (uint)!bVar6 * auVar28._24_4_;
        bVar6 = (bool)((byte)(uVar22 >> 7) & 1);
        auVar26._28_4_ = (uint)bVar6 * auVar24._28_4_ | (uint)!bVar6 * auVar28._28_4_;
        auVar26._32_4_ =
             (uint)(bVar11 & 1) * auVar24._32_4_ | (uint)!(bool)(bVar11 & 1) * auVar28._32_4_;
        bVar6 = (bool)(bVar11 >> 1 & 1);
        auVar26._36_4_ = (uint)bVar6 * auVar24._36_4_ | (uint)!bVar6 * auVar28._36_4_;
        bVar6 = (bool)(bVar11 >> 2 & 1);
        auVar26._40_4_ = (uint)bVar6 * auVar24._40_4_ | (uint)!bVar6 * auVar28._40_4_;
        bVar6 = (bool)(bVar11 >> 3 & 1);
        auVar26._44_4_ = (uint)bVar6 * auVar24._44_4_ | (uint)!bVar6 * auVar28._44_4_;
        bVar6 = (bool)(bVar11 >> 4 & 1);
        auVar26._48_4_ = (uint)bVar6 * auVar24._48_4_ | (uint)!bVar6 * auVar28._48_4_;
        bVar6 = (bool)(bVar11 >> 5 & 1);
        auVar26._52_4_ = (uint)bVar6 * auVar24._52_4_ | (uint)!bVar6 * auVar28._52_4_;
        bVar6 = (bool)(bVar11 >> 6 & 1);
        auVar26._56_4_ = (uint)bVar6 * auVar24._56_4_ | (uint)!bVar6 * auVar28._56_4_;
        auVar26._60_4_ =
             (uint)(bVar11 >> 7) * auVar24._60_4_ | (uint)!(bool)(bVar11 >> 7) * auVar28._60_4_;
        auVar23 = vextracti64x4_avx512f(auVar26,1);
        auVar24 = vpmulld_avx512f(auVar26,ZEXT3264(auVar23));
        auVar7 = vpmulld_avx(auVar24._0_16_,auVar24._16_16_);
        auVar8 = vpshufd_avx(auVar7,0xee);
        auVar7 = vpmulld_avx(auVar7,auVar8);
        auVar8 = vpshufd_avx(auVar7,0x55);
        auVar7 = vpmulld_avx(auVar7,auVar8);
        iVar37 = auVar7._0_4_;
      }
      uVar15 = iVar37 * uVar15;
      uVar14 = (ulong)(fx->d).nd;
      if (uVar14 != 0) {
        auVar24 = vpbroadcastq_avx512f();
        auVar25 = vpbroadcastd_avx512f(ZEXT416(1));
        uVar17 = 0;
        auVar26 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
        auVar27 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
        do {
          auVar28 = vmovdqa64_avx512f(auVar25);
          auVar25 = vpbroadcastq_avx512f();
          auVar29 = vporq_avx512f(auVar25,auVar26);
          auVar25 = vporq_avx512f(auVar25,auVar27);
          uVar9 = vpcmpuq_avx512f(auVar25,auVar24,2);
          bVar10 = (byte)uVar9;
          uVar9 = vpcmpuq_avx512f(auVar29,auVar24,2);
          bVar11 = (byte)uVar9;
          uVar22 = CONCAT11(bVar11,bVar10);
          auVar25 = vmovdqu32_avx512f(*(undefined1 (*) [64])((fx->d).d + uVar17));
          auVar30._4_4_ = (uint)((byte)(uVar22 >> 1) & 1) * auVar25._4_4_;
          auVar30._0_4_ = (uint)(bVar10 & 1) * auVar25._0_4_;
          auVar30._8_4_ = (uint)((byte)(uVar22 >> 2) & 1) * auVar25._8_4_;
          auVar30._12_4_ = (uint)((byte)(uVar22 >> 3) & 1) * auVar25._12_4_;
          auVar30._16_4_ = (uint)((byte)(uVar22 >> 4) & 1) * auVar25._16_4_;
          auVar30._20_4_ = (uint)((byte)(uVar22 >> 5) & 1) * auVar25._20_4_;
          auVar30._24_4_ = (uint)((byte)(uVar22 >> 6) & 1) * auVar25._24_4_;
          auVar30._28_4_ = (uint)((byte)(uVar22 >> 7) & 1) * auVar25._28_4_;
          auVar30._32_4_ = (uint)(bVar11 & 1) * auVar25._32_4_;
          auVar30._36_4_ = (uint)(bVar11 >> 1 & 1) * auVar25._36_4_;
          auVar30._40_4_ = (uint)(bVar11 >> 2 & 1) * auVar25._40_4_;
          auVar30._44_4_ = (uint)(bVar11 >> 3 & 1) * auVar25._44_4_;
          auVar30._48_4_ = (uint)(bVar11 >> 4 & 1) * auVar25._48_4_;
          auVar30._52_4_ = (uint)(bVar11 >> 5 & 1) * auVar25._52_4_;
          auVar30._56_4_ = (uint)(bVar11 >> 6 & 1) * auVar25._56_4_;
          auVar30._60_4_ = (uint)(bVar11 >> 7) * auVar25._60_4_;
          auVar25 = vpmulld_avx512f(auVar30,auVar28);
          uVar17 = uVar17 + 0x10;
        } while ((uVar14 + 0xf & 0x1fffffff0) != uVar17);
        auVar24 = vmovdqa32_avx512f(auVar25);
        auVar27._0_4_ =
             (uint)(bVar10 & 1) * auVar24._0_4_ | (uint)!(bool)(bVar10 & 1) * auVar28._0_4_;
        bVar6 = (bool)((byte)(uVar22 >> 1) & 1);
        auVar27._4_4_ = (uint)bVar6 * auVar24._4_4_ | (uint)!bVar6 * auVar28._4_4_;
        bVar6 = (bool)((byte)(uVar22 >> 2) & 1);
        auVar27._8_4_ = (uint)bVar6 * auVar24._8_4_ | (uint)!bVar6 * auVar28._8_4_;
        bVar6 = (bool)((byte)(uVar22 >> 3) & 1);
        auVar27._12_4_ = (uint)bVar6 * auVar24._12_4_ | (uint)!bVar6 * auVar28._12_4_;
        bVar6 = (bool)((byte)(uVar22 >> 4) & 1);
        auVar27._16_4_ = (uint)bVar6 * auVar24._16_4_ | (uint)!bVar6 * auVar28._16_4_;
        bVar6 = (bool)((byte)(uVar22 >> 5) & 1);
        auVar27._20_4_ = (uint)bVar6 * auVar24._20_4_ | (uint)!bVar6 * auVar28._20_4_;
        bVar6 = (bool)((byte)(uVar22 >> 6) & 1);
        auVar27._24_4_ = (uint)bVar6 * auVar24._24_4_ | (uint)!bVar6 * auVar28._24_4_;
        bVar6 = (bool)((byte)(uVar22 >> 7) & 1);
        auVar27._28_4_ = (uint)bVar6 * auVar24._28_4_ | (uint)!bVar6 * auVar28._28_4_;
        auVar27._32_4_ =
             (uint)(bVar11 & 1) * auVar24._32_4_ | (uint)!(bool)(bVar11 & 1) * auVar28._32_4_;
        bVar6 = (bool)(bVar11 >> 1 & 1);
        auVar27._36_4_ = (uint)bVar6 * auVar24._36_4_ | (uint)!bVar6 * auVar28._36_4_;
        bVar6 = (bool)(bVar11 >> 2 & 1);
        auVar27._40_4_ = (uint)bVar6 * auVar24._40_4_ | (uint)!bVar6 * auVar28._40_4_;
        bVar6 = (bool)(bVar11 >> 3 & 1);
        auVar27._44_4_ = (uint)bVar6 * auVar24._44_4_ | (uint)!bVar6 * auVar28._44_4_;
        bVar6 = (bool)(bVar11 >> 4 & 1);
        auVar27._48_4_ = (uint)bVar6 * auVar24._48_4_ | (uint)!bVar6 * auVar28._48_4_;
        bVar6 = (bool)(bVar11 >> 5 & 1);
        auVar27._52_4_ = (uint)bVar6 * auVar24._52_4_ | (uint)!bVar6 * auVar28._52_4_;
        bVar6 = (bool)(bVar11 >> 6 & 1);
        auVar27._56_4_ = (uint)bVar6 * auVar24._56_4_ | (uint)!bVar6 * auVar28._56_4_;
        auVar27._60_4_ =
             (uint)(bVar11 >> 7) * auVar24._60_4_ | (uint)!(bool)(bVar11 >> 7) * auVar28._60_4_;
        auVar23 = vextracti64x4_avx512f(auVar27,1);
        auVar24 = vpmulld_avx512f(auVar27,ZEXT3264(auVar23));
        auVar7 = vpmulld_avx(auVar24._0_16_,auVar24._16_16_);
        auVar8 = vpshufd_avx(auVar7,0xee);
        auVar7 = vpmulld_avx(auVar7,auVar8);
        auVar8 = vpshufd_avx(auVar7,0x55);
        auVar7 = vpmulld_avx(auVar7,auVar8);
        iVar38 = auVar7._0_4_;
      }
      if (uVar13 * iVar38 != uVar15) {
        __assert_fail("dimensions_match(m_leftImpl.dimensions(), m_rightImpl.dimensions())",
                      "/usr/include/eigen3/unsupported/Eigen/CXX11/src/Tensor/TensorAssign.h",0x92,
                      "bool Eigen::TensorEvaluator<const Eigen::TensorAssignOp<Eigen::TensorMap<Eigen::Tensor<float, 1>>, const Eigen::TensorMap<Eigen::Tensor<float, 1>>>, Eigen::DefaultDevice>::evalSubExprsIfNeeded(EvaluatorPointerType) [Derived = const Eigen::TensorAssignOp<Eigen::TensorMap<Eigen::Tensor<float, 1>>, const Eigen::TensorMap<Eigen::Tensor<float, 1>>>, Device = Eigen::DefaultDevice]"
                     );
      }
      pfVar4 = pTVar3->v;
      if (fx->v == (float *)0x0) {
        uVar14 = (ulong)(uVar15 & 0xffffffc0);
        if (0x3f < uVar15) {
          uVar17 = 0;
          lVar19 = 0;
          pfVar18 = pfVar4;
          do {
            lVar20 = 0;
            do {
              auVar24 = vmovdqu64_avx512f(*(undefined1 (*) [64])((long)pfVar18 + lVar20));
              auVar24 = vmovdqu64_avx512f(auVar24);
              *(undefined1 (*) [64])(lVar19 + lVar20) = auVar24;
              lVar20 = lVar20 + 0x40;
            } while (lVar20 != 0x100);
            uVar17 = uVar17 + 0x40;
            lVar19 = lVar19 + 0x100;
            pfVar18 = pfVar18 + 0x40;
          } while (uVar17 < uVar14);
        }
        uVar13 = uVar15 & 0xfffffff0;
        if ((uVar15 & 0xffffffc0) < uVar13) {
          do {
            auVar24 = vmovdqu64_avx512f(*(undefined1 (*) [64])(pfVar4 + uVar14));
            auVar24 = vmovdqu64_avx512f(auVar24);
            *(undefined1 (*) [64])(uVar14 * 4) = auVar24;
            uVar14 = uVar14 + 0x10;
          } while (uVar14 < uVar13);
        }
        if (uVar13 != uVar15) {
          if (pfVar4 != (float *)0x0) {
            __assert_fail("m_data != __null",
                          "/usr/include/eigen3/unsupported/Eigen/CXX11/src/Tensor/TensorEvaluator.h"
                          ,100,
                          "CoeffReturnType &Eigen::TensorEvaluator<Eigen::TensorMap<Eigen::Tensor<float, 1>>, Eigen::DefaultDevice>::coeffRef(Index) [Derived = Eigen::TensorMap<Eigen::Tensor<float, 1>>, Device = Eigen::DefaultDevice]"
                         );
          }
          __assert_fail("m_data != __null",
                        "/usr/include/eigen3/unsupported/Eigen/CXX11/src/Tensor/TensorEvaluator.h",
                        0x123,
                        "CoeffReturnType Eigen::TensorEvaluator<const Eigen::TensorMap<Eigen::Tensor<float, 1>>, Eigen::DefaultDevice>::coeff(Index) const [Derived = const Eigen::TensorMap<Eigen::Tensor<float, 1>>, Device = Eigen::DefaultDevice]"
                       );
        }
      }
      else {
        memcpy(fx->v,pfVar4,(ulong)uVar15 << 2);
      }
    }
    else {
      if ((uVar13 == 1) || (uVar15 != 1)) {
        __assert_fail("xs[0]->d.bd == 1 && fx.d.bd != 1",
                      "/workspace/llm4binary/github/license_c_cmakelists/trevorcohn[P]mantis/dynet/dynet/nodes.cc"
                      ,0xef,
                      "void dynet::AffineTransform::forward_dev_impl(const MyDevice &, const vector<const Tensor *> &, Tensor &) const [MyDevice = dynet::Device_CPU]"
                     );
      }
      uVar14 = (ulong)(fx->d).nd;
      if (uVar14 == 0) {
        lVar19 = 1;
      }
      else {
        uVar14 = uVar14 + 0xf & 0x1fffffff0;
        auVar24 = vpbroadcastq_avx512f();
        auVar25 = vpbroadcastd_avx512f(ZEXT416(1));
        uVar17 = 0;
        auVar26 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
        auVar27 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
        do {
          auVar28 = vmovdqa64_avx512f(auVar25);
          auVar25 = vpbroadcastq_avx512f();
          auVar29 = vporq_avx512f(auVar25,auVar26);
          auVar25 = vporq_avx512f(auVar25,auVar27);
          uVar9 = vpcmpuq_avx512f(auVar25,auVar24,2);
          bVar10 = (byte)uVar9;
          uVar9 = vpcmpuq_avx512f(auVar29,auVar24,2);
          bVar11 = (byte)uVar9;
          uVar22 = CONCAT11(bVar11,bVar10);
          auVar29 = vmovdqu32_avx512f(*(undefined1 (*) [64])((fx->d).d + uVar17));
          auVar25._4_4_ = (uint)((byte)(uVar22 >> 1) & 1) * auVar29._4_4_;
          auVar25._0_4_ = (uint)(bVar10 & 1) * auVar29._0_4_;
          auVar25._8_4_ = (uint)((byte)(uVar22 >> 2) & 1) * auVar29._8_4_;
          auVar25._12_4_ = (uint)((byte)(uVar22 >> 3) & 1) * auVar29._12_4_;
          auVar25._16_4_ = (uint)((byte)(uVar22 >> 4) & 1) * auVar29._16_4_;
          auVar25._20_4_ = (uint)((byte)(uVar22 >> 5) & 1) * auVar29._20_4_;
          auVar25._24_4_ = (uint)((byte)(uVar22 >> 6) & 1) * auVar29._24_4_;
          auVar25._28_4_ = (uint)((byte)(uVar22 >> 7) & 1) * auVar29._28_4_;
          auVar25._32_4_ = (uint)(bVar11 & 1) * auVar29._32_4_;
          auVar25._36_4_ = (uint)(bVar11 >> 1 & 1) * auVar29._36_4_;
          auVar25._40_4_ = (uint)(bVar11 >> 2 & 1) * auVar29._40_4_;
          auVar25._44_4_ = (uint)(bVar11 >> 3 & 1) * auVar29._44_4_;
          auVar25._48_4_ = (uint)(bVar11 >> 4 & 1) * auVar29._48_4_;
          auVar25._52_4_ = (uint)(bVar11 >> 5 & 1) * auVar29._52_4_;
          auVar25._56_4_ = (uint)(bVar11 >> 6 & 1) * auVar29._56_4_;
          auVar25._60_4_ = (uint)(bVar11 >> 7) * auVar29._60_4_;
          auVar25 = vpmulld_avx512f(auVar25,auVar28);
          uVar17 = uVar17 + 0x10;
        } while (uVar14 != uVar17);
        auVar25 = vmovdqa32_avx512f(auVar25);
        auVar24._0_4_ =
             (uint)(bVar10 & 1) * auVar25._0_4_ | (uint)!(bool)(bVar10 & 1) * auVar28._0_4_;
        bVar6 = (bool)((byte)(uVar22 >> 1) & 1);
        auVar24._4_4_ = (uint)bVar6 * auVar25._4_4_ | (uint)!bVar6 * auVar28._4_4_;
        bVar6 = (bool)((byte)(uVar22 >> 2) & 1);
        auVar24._8_4_ = (uint)bVar6 * auVar25._8_4_ | (uint)!bVar6 * auVar28._8_4_;
        bVar6 = (bool)((byte)(uVar22 >> 3) & 1);
        auVar24._12_4_ = (uint)bVar6 * auVar25._12_4_ | (uint)!bVar6 * auVar28._12_4_;
        bVar6 = (bool)((byte)(uVar22 >> 4) & 1);
        auVar24._16_4_ = (uint)bVar6 * auVar25._16_4_ | (uint)!bVar6 * auVar28._16_4_;
        bVar6 = (bool)((byte)(uVar22 >> 5) & 1);
        auVar24._20_4_ = (uint)bVar6 * auVar25._20_4_ | (uint)!bVar6 * auVar28._20_4_;
        bVar6 = (bool)((byte)(uVar22 >> 6) & 1);
        auVar24._24_4_ = (uint)bVar6 * auVar25._24_4_ | (uint)!bVar6 * auVar28._24_4_;
        bVar6 = (bool)((byte)(uVar22 >> 7) & 1);
        auVar24._28_4_ = (uint)bVar6 * auVar25._28_4_ | (uint)!bVar6 * auVar28._28_4_;
        auVar24._32_4_ =
             (uint)(bVar11 & 1) * auVar25._32_4_ | (uint)!(bool)(bVar11 & 1) * auVar28._32_4_;
        bVar6 = (bool)(bVar11 >> 1 & 1);
        auVar24._36_4_ = (uint)bVar6 * auVar25._36_4_ | (uint)!bVar6 * auVar28._36_4_;
        bVar6 = (bool)(bVar11 >> 2 & 1);
        auVar24._40_4_ = (uint)bVar6 * auVar25._40_4_ | (uint)!bVar6 * auVar28._40_4_;
        bVar6 = (bool)(bVar11 >> 3 & 1);
        auVar24._44_4_ = (uint)bVar6 * auVar25._44_4_ | (uint)!bVar6 * auVar28._44_4_;
        bVar6 = (bool)(bVar11 >> 4 & 1);
        auVar24._48_4_ = (uint)bVar6 * auVar25._48_4_ | (uint)!bVar6 * auVar28._48_4_;
        bVar6 = (bool)(bVar11 >> 5 & 1);
        auVar24._52_4_ = (uint)bVar6 * auVar25._52_4_ | (uint)!bVar6 * auVar28._52_4_;
        bVar6 = (bool)(bVar11 >> 6 & 1);
        auVar24._56_4_ = (uint)bVar6 * auVar25._56_4_ | (uint)!bVar6 * auVar28._56_4_;
        auVar24._60_4_ =
             (uint)(bVar11 >> 7) * auVar25._60_4_ | (uint)!(bool)(bVar11 >> 7) * auVar28._60_4_;
        auVar23 = vextracti64x4_avx512f(auVar24,1);
        auVar24 = vpmulld_avx512f(auVar24,ZEXT3264(auVar23));
        auVar7 = vpmulld_avx(auVar24._0_16_,auVar24._16_16_);
        auVar8 = vpshufd_avx(auVar7,0xee);
        auVar7 = vpmulld_avx(auVar7,auVar8);
        auVar8 = vpshufd_avx(auVar7,0x55);
        auVar7 = vpmulld_avx(auVar7,auVar8);
        lVar19 = CONCAT44((int)(uVar14 >> 0x20),auVar7._0_4_);
      }
      pfVar4 = fx->v;
      pfVar18 = pTVar3->v;
      lVar20 = 0;
      do {
        memcpy((void *)((long)pfVar4 + lVar20),pfVar18,lVar19 * 4);
        lVar20 = lVar20 + lVar19 * 4;
      } while ((ulong)uVar13 * lVar19 * 4 != lVar20);
    }
    ppTVar12 = (xs->
               super__Vector_base<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_>).
               _M_impl.super__Vector_impl_data._M_start;
    if (8 < (ulong)((long)(xs->
                          super__Vector_base<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_>
                          )._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar12)) {
      auVar24 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
      auVar25 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      uVar14 = 1;
      do {
        uVar13 = (ppTVar12[uVar14]->d).bd;
        local_78 = uVar14;
        if ((uVar13 == 1) && (uVar15 = (int)uVar14 + 1, (ppTVar12[uVar15]->d).bd == (fx->d).bd)) {
          Tensor::operator*(&local_70,ppTVar12[uVar14]);
          pTVar3 = (xs->
                   super__Vector_base<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_>
                   )._M_impl.super__Vector_impl_data._M_start[uVar15];
          uVar13 = 1;
          if (1 < (pTVar3->d).nd) {
            uVar13 = (pTVar3->d).d[1];
          }
          local_98.
          super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
          .
          super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
          .m_data = pTVar3->v;
          local_98.
          super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
          .
          super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
          .m_rows.m_value = (long)(pTVar3->d).d[0];
          local_98.
          super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
          .
          super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
          .m_cols.m_value = (long)(uVar13 * (pTVar3->d).bd);
          local_b8.
          super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
          .
          super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
          .m_cols.m_value =
               local_70.
               super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
               .
               super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
               .m_cols.m_value;
          local_b8.
          super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
          .
          super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
          .m_data = local_70.
                    super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                    .
                    super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                    .m_data;
          local_b8.
          super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
          .
          super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
          .m_rows.m_value =
               local_70.
               super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
               .
               super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
               .m_rows.m_value;
          if (local_70.
              super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
              .
              super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
              .m_cols.m_value !=
              local_98.
              super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
              .
              super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
              .m_rows.m_value) {
LAB_0033bbcd:
            __assert_fail("lhs.cols() == rhs.rows() && \"invalid matrix product\" && \"if you wanted a coeff-wise or a dot product use the respective explicit functions\""
                          ,"/usr/include/eigen3/Eigen/src/Core/Product.h",0x62,
                          "Eigen::Product<Eigen::Map<Eigen::Matrix<float, -1, -1>>, Eigen::Map<Eigen::Matrix<float, -1, -1>>>::Product(const Lhs &, const Rhs &) [Lhs = Eigen::Map<Eigen::Matrix<float, -1, -1>>, Rhs = Eigen::Map<Eigen::Matrix<float, -1, -1>>, Option = 0]"
                         );
          }
          uVar13 = 1;
          if (1 < (fx->d).nd) {
            uVar13 = (fx->d).d[1];
          }
          local_50.
          super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
          .
          super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
          .m_data = fx->v;
          local_50.
          super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
          .
          super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
          .m_rows.m_value = (long)(fx->d).d[0];
          local_50.
          super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
          .
          super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
          .m_cols.m_value = (long)(uVar13 * (fx->d).bd);
          if ((local_70.
               super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
               .
               super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
               .m_rows.m_value !=
               local_50.
               super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
               .
               super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
               .m_rows.m_value) ||
             (local_98.
              super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
              .
              super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
              .m_cols.m_value !=
              local_50.
              super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
              .
              super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
              .m_cols.m_value)) {
LAB_0033bbab:
            __assert_fail("dst.rows() == src.rows() && dst.cols() == src.cols()",
                          "/usr/include/eigen3/Eigen/src/Core/ProductEvaluators.h",0xa1,
                          "static void Eigen::internal::Assignment<Eigen::Map<Eigen::Matrix<float, -1, -1>>, Eigen::Product<Eigen::Map<Eigen::Matrix<float, -1, -1>>, Eigen::Map<Eigen::Matrix<float, -1, -1>>>, Eigen::internal::add_assign_op<float, float>>::run(DstXprType &, const SrcXprType &, const internal::add_assign_op<Scalar, Scalar> &) [DstXprType = Eigen::Map<Eigen::Matrix<float, -1, -1>>, SrcXprType = Eigen::Product<Eigen::Map<Eigen::Matrix<float, -1, -1>>, Eigen::Map<Eigen::Matrix<float, -1, -1>>>, Functor = Eigen::internal::add_assign_op<float, float>, Kind = Eigen::internal::Dense2Dense, EnableIf = void]"
                         );
          }
          Eigen::internal::
          generic_product_impl<Eigen::Map<Eigen::Matrix<float,-1,-1,0,-1,-1>,0,Eigen::Stride<0,0>>,Eigen::Map<Eigen::Matrix<float,-1,-1,0,-1,-1>,0,Eigen::Stride<0,0>>,Eigen::DenseShape,Eigen::DenseShape,8>
          ::addTo<Eigen::Map<Eigen::Matrix<float,_1,_1,0,_1,_1>,0,Eigen::Stride<0,0>>>
                    (&local_50,&local_b8,&local_98);
          auVar24 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
          auVar25 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
        }
        else {
          uVar21 = (int)uVar14 + 1;
          uVar15 = (ppTVar12[uVar21]->d).bd;
          if ((uVar15 != 1) && (uVar15 != uVar13)) {
            __assert_fail("xs[i+1]->d.bd == 1 || xs[i+1]->d.bd == xs[i]->d.bd",
                          "/workspace/llm4binary/github/license_c_cmakelists/trevorcohn[P]mantis/dynet/dynet/nodes.cc"
                          ,0x108,
                          "void dynet::AffineTransform::forward_dev_impl(const MyDevice &, const vector<const Tensor *> &, Tensor &) const [MyDevice = dynet::Device_CPU]"
                         );
          }
          uVar13 = (fx->d).bd;
          if (uVar13 != 0) {
            uVar17 = 0;
            do {
              ppTVar12 = (xs->
                         super__Vector_base<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_>
                         )._M_impl.super__Vector_impl_data._M_start;
              pTVar3 = ppTVar12[uVar14];
              uVar15 = (pTVar3->d).nd;
              iVar38 = 1;
              iVar37 = 1;
              if ((ulong)uVar15 != 0) {
                auVar26 = vpbroadcastq_avx512f();
                uVar16 = 0;
                auVar27 = vpbroadcastd_avx512f(ZEXT416(1));
                do {
                  auVar28 = vmovdqa64_avx512f(auVar27);
                  auVar27 = vpbroadcastq_avx512f();
                  auVar29 = vporq_avx512f(auVar27,auVar24);
                  auVar27 = vporq_avx512f(auVar27,auVar25);
                  uVar9 = vpcmpuq_avx512f(auVar27,auVar26,2);
                  bVar10 = (byte)uVar9;
                  uVar9 = vpcmpuq_avx512f(auVar29,auVar26,2);
                  bVar11 = (byte)uVar9;
                  uVar22 = CONCAT11(bVar11,bVar10);
                  auVar27 = vmovdqu32_avx512f(*(undefined1 (*) [64])((pTVar3->d).d + uVar16));
                  auVar31._4_4_ = (uint)((byte)(uVar22 >> 1) & 1) * auVar27._4_4_;
                  auVar31._0_4_ = (uint)(bVar10 & 1) * auVar27._0_4_;
                  auVar31._8_4_ = (uint)((byte)(uVar22 >> 2) & 1) * auVar27._8_4_;
                  auVar31._12_4_ = (uint)((byte)(uVar22 >> 3) & 1) * auVar27._12_4_;
                  auVar31._16_4_ = (uint)((byte)(uVar22 >> 4) & 1) * auVar27._16_4_;
                  auVar31._20_4_ = (uint)((byte)(uVar22 >> 5) & 1) * auVar27._20_4_;
                  auVar31._24_4_ = (uint)((byte)(uVar22 >> 6) & 1) * auVar27._24_4_;
                  auVar31._28_4_ = (uint)((byte)(uVar22 >> 7) & 1) * auVar27._28_4_;
                  auVar31._32_4_ = (uint)(bVar11 & 1) * auVar27._32_4_;
                  auVar31._36_4_ = (uint)(bVar11 >> 1 & 1) * auVar27._36_4_;
                  auVar31._40_4_ = (uint)(bVar11 >> 2 & 1) * auVar27._40_4_;
                  auVar31._44_4_ = (uint)(bVar11 >> 3 & 1) * auVar27._44_4_;
                  auVar31._48_4_ = (uint)(bVar11 >> 4 & 1) * auVar27._48_4_;
                  auVar31._52_4_ = (uint)(bVar11 >> 5 & 1) * auVar27._52_4_;
                  auVar31._56_4_ = (uint)(bVar11 >> 6 & 1) * auVar27._56_4_;
                  auVar31._60_4_ = (uint)(bVar11 >> 7) * auVar27._60_4_;
                  auVar27 = vpmulld_avx512f(auVar31,auVar28);
                  uVar16 = uVar16 + 0x10;
                } while (((ulong)uVar15 + 0xf & 0x1fffffff0) != uVar16);
                auVar26 = vmovdqa32_avx512f(auVar27);
                auVar32._0_4_ =
                     (uint)(bVar10 & 1) * auVar26._0_4_ | (uint)!(bool)(bVar10 & 1) * auVar28._0_4_;
                bVar6 = (bool)((byte)(uVar22 >> 1) & 1);
                auVar32._4_4_ = (uint)bVar6 * auVar26._4_4_ | (uint)!bVar6 * auVar28._4_4_;
                bVar6 = (bool)((byte)(uVar22 >> 2) & 1);
                auVar32._8_4_ = (uint)bVar6 * auVar26._8_4_ | (uint)!bVar6 * auVar28._8_4_;
                bVar6 = (bool)((byte)(uVar22 >> 3) & 1);
                auVar32._12_4_ = (uint)bVar6 * auVar26._12_4_ | (uint)!bVar6 * auVar28._12_4_;
                bVar6 = (bool)((byte)(uVar22 >> 4) & 1);
                auVar32._16_4_ = (uint)bVar6 * auVar26._16_4_ | (uint)!bVar6 * auVar28._16_4_;
                bVar6 = (bool)((byte)(uVar22 >> 5) & 1);
                auVar32._20_4_ = (uint)bVar6 * auVar26._20_4_ | (uint)!bVar6 * auVar28._20_4_;
                bVar6 = (bool)((byte)(uVar22 >> 6) & 1);
                auVar32._24_4_ = (uint)bVar6 * auVar26._24_4_ | (uint)!bVar6 * auVar28._24_4_;
                bVar6 = (bool)((byte)(uVar22 >> 7) & 1);
                auVar32._28_4_ = (uint)bVar6 * auVar26._28_4_ | (uint)!bVar6 * auVar28._28_4_;
                auVar32._32_4_ =
                     (uint)(bVar11 & 1) * auVar26._32_4_ |
                     (uint)!(bool)(bVar11 & 1) * auVar28._32_4_;
                bVar6 = (bool)(bVar11 >> 1 & 1);
                auVar32._36_4_ = (uint)bVar6 * auVar26._36_4_ | (uint)!bVar6 * auVar28._36_4_;
                bVar6 = (bool)(bVar11 >> 2 & 1);
                auVar32._40_4_ = (uint)bVar6 * auVar26._40_4_ | (uint)!bVar6 * auVar28._40_4_;
                bVar6 = (bool)(bVar11 >> 3 & 1);
                auVar32._44_4_ = (uint)bVar6 * auVar26._44_4_ | (uint)!bVar6 * auVar28._44_4_;
                bVar6 = (bool)(bVar11 >> 4 & 1);
                auVar32._48_4_ = (uint)bVar6 * auVar26._48_4_ | (uint)!bVar6 * auVar28._48_4_;
                bVar6 = (bool)(bVar11 >> 5 & 1);
                auVar32._52_4_ = (uint)bVar6 * auVar26._52_4_ | (uint)!bVar6 * auVar28._52_4_;
                bVar6 = (bool)(bVar11 >> 6 & 1);
                auVar32._56_4_ = (uint)bVar6 * auVar26._56_4_ | (uint)!bVar6 * auVar28._56_4_;
                auVar32._60_4_ =
                     (uint)(bVar11 >> 7) * auVar26._60_4_ |
                     (uint)!(bool)(bVar11 >> 7) * auVar28._60_4_;
                auVar23 = vextracti64x4_avx512f(auVar32,1);
                auVar26 = vpmulld_avx512f(auVar32,ZEXT3264(auVar23));
                auVar7 = vpmulld_avx(auVar26._0_16_,auVar26._16_16_);
                auVar8 = vpshufd_avx(auVar7,0xee);
                auVar7 = vpmulld_avx(auVar7,auVar8);
                auVar8 = vpshufd_avx(auVar7,0x55);
                auVar7 = vpmulld_avx(auVar7,auVar8);
                iVar37 = auVar7._0_4_;
              }
              local_b8.
              super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
              .
              super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
              .m_cols.m_value = (long)(pTVar3->d).d[1];
              if (uVar15 < 2) {
                local_b8.
                super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                .
                super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                .m_cols.m_value = 1;
              }
              pTVar5 = ppTVar12[uVar21];
              uVar15 = (pTVar5->d).nd;
              if ((ulong)uVar15 != 0) {
                auVar26 = vpbroadcastq_avx512f();
                uVar16 = 0;
                auVar27 = vpbroadcastd_avx512f(ZEXT416(1));
                do {
                  auVar28 = vmovdqa64_avx512f(auVar27);
                  auVar27 = vpbroadcastq_avx512f();
                  auVar29 = vporq_avx512f(auVar27,auVar24);
                  auVar27 = vporq_avx512f(auVar27,auVar25);
                  uVar9 = vpcmpuq_avx512f(auVar27,auVar26,2);
                  bVar10 = (byte)uVar9;
                  uVar9 = vpcmpuq_avx512f(auVar29,auVar26,2);
                  bVar11 = (byte)uVar9;
                  uVar22 = CONCAT11(bVar11,bVar10);
                  auVar27 = vmovdqu32_avx512f(*(undefined1 (*) [64])((pTVar5->d).d + uVar16));
                  auVar33._4_4_ = (uint)((byte)(uVar22 >> 1) & 1) * auVar27._4_4_;
                  auVar33._0_4_ = (uint)(bVar10 & 1) * auVar27._0_4_;
                  auVar33._8_4_ = (uint)((byte)(uVar22 >> 2) & 1) * auVar27._8_4_;
                  auVar33._12_4_ = (uint)((byte)(uVar22 >> 3) & 1) * auVar27._12_4_;
                  auVar33._16_4_ = (uint)((byte)(uVar22 >> 4) & 1) * auVar27._16_4_;
                  auVar33._20_4_ = (uint)((byte)(uVar22 >> 5) & 1) * auVar27._20_4_;
                  auVar33._24_4_ = (uint)((byte)(uVar22 >> 6) & 1) * auVar27._24_4_;
                  auVar33._28_4_ = (uint)((byte)(uVar22 >> 7) & 1) * auVar27._28_4_;
                  auVar33._32_4_ = (uint)(bVar11 & 1) * auVar27._32_4_;
                  auVar33._36_4_ = (uint)(bVar11 >> 1 & 1) * auVar27._36_4_;
                  auVar33._40_4_ = (uint)(bVar11 >> 2 & 1) * auVar27._40_4_;
                  auVar33._44_4_ = (uint)(bVar11 >> 3 & 1) * auVar27._44_4_;
                  auVar33._48_4_ = (uint)(bVar11 >> 4 & 1) * auVar27._48_4_;
                  auVar33._52_4_ = (uint)(bVar11 >> 5 & 1) * auVar27._52_4_;
                  auVar33._56_4_ = (uint)(bVar11 >> 6 & 1) * auVar27._56_4_;
                  auVar33._60_4_ = (uint)(bVar11 >> 7) * auVar27._60_4_;
                  auVar27 = vpmulld_avx512f(auVar33,auVar28);
                  uVar16 = uVar16 + 0x10;
                } while (((ulong)uVar15 + 0xf & 0x1fffffff0) != uVar16);
                auVar26 = vmovdqa32_avx512f(auVar27);
                auVar34._0_4_ =
                     (uint)(bVar10 & 1) * auVar26._0_4_ | (uint)!(bool)(bVar10 & 1) * auVar28._0_4_;
                bVar6 = (bool)((byte)(uVar22 >> 1) & 1);
                auVar34._4_4_ = (uint)bVar6 * auVar26._4_4_ | (uint)!bVar6 * auVar28._4_4_;
                bVar6 = (bool)((byte)(uVar22 >> 2) & 1);
                auVar34._8_4_ = (uint)bVar6 * auVar26._8_4_ | (uint)!bVar6 * auVar28._8_4_;
                bVar6 = (bool)((byte)(uVar22 >> 3) & 1);
                auVar34._12_4_ = (uint)bVar6 * auVar26._12_4_ | (uint)!bVar6 * auVar28._12_4_;
                bVar6 = (bool)((byte)(uVar22 >> 4) & 1);
                auVar34._16_4_ = (uint)bVar6 * auVar26._16_4_ | (uint)!bVar6 * auVar28._16_4_;
                bVar6 = (bool)((byte)(uVar22 >> 5) & 1);
                auVar34._20_4_ = (uint)bVar6 * auVar26._20_4_ | (uint)!bVar6 * auVar28._20_4_;
                bVar6 = (bool)((byte)(uVar22 >> 6) & 1);
                auVar34._24_4_ = (uint)bVar6 * auVar26._24_4_ | (uint)!bVar6 * auVar28._24_4_;
                bVar6 = (bool)((byte)(uVar22 >> 7) & 1);
                auVar34._28_4_ = (uint)bVar6 * auVar26._28_4_ | (uint)!bVar6 * auVar28._28_4_;
                auVar34._32_4_ =
                     (uint)(bVar11 & 1) * auVar26._32_4_ |
                     (uint)!(bool)(bVar11 & 1) * auVar28._32_4_;
                bVar6 = (bool)(bVar11 >> 1 & 1);
                auVar34._36_4_ = (uint)bVar6 * auVar26._36_4_ | (uint)!bVar6 * auVar28._36_4_;
                bVar6 = (bool)(bVar11 >> 2 & 1);
                auVar34._40_4_ = (uint)bVar6 * auVar26._40_4_ | (uint)!bVar6 * auVar28._40_4_;
                bVar6 = (bool)(bVar11 >> 3 & 1);
                auVar34._44_4_ = (uint)bVar6 * auVar26._44_4_ | (uint)!bVar6 * auVar28._44_4_;
                bVar6 = (bool)(bVar11 >> 4 & 1);
                auVar34._48_4_ = (uint)bVar6 * auVar26._48_4_ | (uint)!bVar6 * auVar28._48_4_;
                bVar6 = (bool)(bVar11 >> 5 & 1);
                auVar34._52_4_ = (uint)bVar6 * auVar26._52_4_ | (uint)!bVar6 * auVar28._52_4_;
                bVar6 = (bool)(bVar11 >> 6 & 1);
                auVar34._56_4_ = (uint)bVar6 * auVar26._56_4_ | (uint)!bVar6 * auVar28._56_4_;
                auVar34._60_4_ =
                     (uint)(bVar11 >> 7) * auVar26._60_4_ |
                     (uint)!(bool)(bVar11 >> 7) * auVar28._60_4_;
                auVar23 = vextracti64x4_avx512f(auVar34,1);
                auVar26 = vpmulld_avx512f(auVar34,ZEXT3264(auVar23));
                auVar7 = vpmulld_avx(auVar26._0_16_,auVar26._16_16_);
                auVar8 = vpshufd_avx(auVar7,0xee);
                auVar7 = vpmulld_avx(auVar7,auVar8);
                auVar8 = vpshufd_avx(auVar7,0x55);
                auVar7 = vpmulld_avx(auVar7,auVar8);
                iVar38 = auVar7._0_4_;
              }
              local_b8.
              super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
              .
              super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
              .m_data = pTVar3->v + (uint)((int)(uVar17 % (ulong)(pTVar3->d).bd) * iVar37);
              uVar1 = (pTVar3->d).d[0];
              local_b8.
              super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
              .
              super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
              .m_rows.m_value = (long)uVar1;
              local_98.
              super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
              .
              super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
              .m_data = pTVar5->v + (uint)((int)(uVar17 % (ulong)(pTVar5->d).bd) * iVar38);
              uVar2 = (pTVar5->d).d[0];
              local_98.
              super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
              .
              super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
              .m_rows.m_value = (long)uVar2;
              local_98.
              super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
              .
              super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
              .m_cols.m_value = (long)(pTVar5->d).d[1];
              if (uVar15 < 2) {
                local_98.
                super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                .
                super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                .m_cols.m_value = 1;
              }
              if ((uint)local_b8.
                        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                        .
                        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                        .m_cols.m_value != uVar2) goto LAB_0033bbcd;
              uVar15 = (fx->d).nd;
              if ((ulong)uVar15 == 0) {
                iVar38 = 1;
              }
              else {
                auVar26 = vpbroadcastq_avx512f();
                uVar16 = 0;
                auVar27 = vpbroadcastd_avx512f(ZEXT416(1));
                do {
                  auVar28 = vmovdqa64_avx512f(auVar27);
                  auVar27 = vpbroadcastq_avx512f();
                  auVar29 = vporq_avx512f(auVar27,auVar24);
                  auVar27 = vporq_avx512f(auVar27,auVar25);
                  uVar9 = vpcmpuq_avx512f(auVar27,auVar26,2);
                  bVar10 = (byte)uVar9;
                  uVar9 = vpcmpuq_avx512f(auVar29,auVar26,2);
                  bVar11 = (byte)uVar9;
                  uVar22 = CONCAT11(bVar11,bVar10);
                  auVar27 = vmovdqu32_avx512f(*(undefined1 (*) [64])((fx->d).d + uVar16));
                  auVar35._4_4_ = (uint)((byte)(uVar22 >> 1) & 1) * auVar27._4_4_;
                  auVar35._0_4_ = (uint)(bVar10 & 1) * auVar27._0_4_;
                  auVar35._8_4_ = (uint)((byte)(uVar22 >> 2) & 1) * auVar27._8_4_;
                  auVar35._12_4_ = (uint)((byte)(uVar22 >> 3) & 1) * auVar27._12_4_;
                  auVar35._16_4_ = (uint)((byte)(uVar22 >> 4) & 1) * auVar27._16_4_;
                  auVar35._20_4_ = (uint)((byte)(uVar22 >> 5) & 1) * auVar27._20_4_;
                  auVar35._24_4_ = (uint)((byte)(uVar22 >> 6) & 1) * auVar27._24_4_;
                  auVar35._28_4_ = (uint)((byte)(uVar22 >> 7) & 1) * auVar27._28_4_;
                  auVar35._32_4_ = (uint)(bVar11 & 1) * auVar27._32_4_;
                  auVar35._36_4_ = (uint)(bVar11 >> 1 & 1) * auVar27._36_4_;
                  auVar35._40_4_ = (uint)(bVar11 >> 2 & 1) * auVar27._40_4_;
                  auVar35._44_4_ = (uint)(bVar11 >> 3 & 1) * auVar27._44_4_;
                  auVar35._48_4_ = (uint)(bVar11 >> 4 & 1) * auVar27._48_4_;
                  auVar35._52_4_ = (uint)(bVar11 >> 5 & 1) * auVar27._52_4_;
                  auVar35._56_4_ = (uint)(bVar11 >> 6 & 1) * auVar27._56_4_;
                  auVar35._60_4_ = (uint)(bVar11 >> 7) * auVar27._60_4_;
                  auVar27 = vpmulld_avx512f(auVar35,auVar28);
                  uVar16 = uVar16 + 0x10;
                } while (((ulong)uVar15 + 0xf & 0x1fffffff0) != uVar16);
                auVar24 = vmovdqa32_avx512f(auVar27);
                auVar36._0_4_ =
                     (uint)(bVar10 & 1) * auVar24._0_4_ | (uint)!(bool)(bVar10 & 1) * auVar28._0_4_;
                bVar6 = (bool)((byte)(uVar22 >> 1) & 1);
                auVar36._4_4_ = (uint)bVar6 * auVar24._4_4_ | (uint)!bVar6 * auVar28._4_4_;
                bVar6 = (bool)((byte)(uVar22 >> 2) & 1);
                auVar36._8_4_ = (uint)bVar6 * auVar24._8_4_ | (uint)!bVar6 * auVar28._8_4_;
                bVar6 = (bool)((byte)(uVar22 >> 3) & 1);
                auVar36._12_4_ = (uint)bVar6 * auVar24._12_4_ | (uint)!bVar6 * auVar28._12_4_;
                bVar6 = (bool)((byte)(uVar22 >> 4) & 1);
                auVar36._16_4_ = (uint)bVar6 * auVar24._16_4_ | (uint)!bVar6 * auVar28._16_4_;
                bVar6 = (bool)((byte)(uVar22 >> 5) & 1);
                auVar36._20_4_ = (uint)bVar6 * auVar24._20_4_ | (uint)!bVar6 * auVar28._20_4_;
                bVar6 = (bool)((byte)(uVar22 >> 6) & 1);
                auVar36._24_4_ = (uint)bVar6 * auVar24._24_4_ | (uint)!bVar6 * auVar28._24_4_;
                bVar6 = (bool)((byte)(uVar22 >> 7) & 1);
                auVar36._28_4_ = (uint)bVar6 * auVar24._28_4_ | (uint)!bVar6 * auVar28._28_4_;
                auVar36._32_4_ =
                     (uint)(bVar11 & 1) * auVar24._32_4_ |
                     (uint)!(bool)(bVar11 & 1) * auVar28._32_4_;
                bVar6 = (bool)(bVar11 >> 1 & 1);
                auVar36._36_4_ = (uint)bVar6 * auVar24._36_4_ | (uint)!bVar6 * auVar28._36_4_;
                bVar6 = (bool)(bVar11 >> 2 & 1);
                auVar36._40_4_ = (uint)bVar6 * auVar24._40_4_ | (uint)!bVar6 * auVar28._40_4_;
                bVar6 = (bool)(bVar11 >> 3 & 1);
                auVar36._44_4_ = (uint)bVar6 * auVar24._44_4_ | (uint)!bVar6 * auVar28._44_4_;
                bVar6 = (bool)(bVar11 >> 4 & 1);
                auVar36._48_4_ = (uint)bVar6 * auVar24._48_4_ | (uint)!bVar6 * auVar28._48_4_;
                bVar6 = (bool)(bVar11 >> 5 & 1);
                auVar36._52_4_ = (uint)bVar6 * auVar24._52_4_ | (uint)!bVar6 * auVar28._52_4_;
                bVar6 = (bool)(bVar11 >> 6 & 1);
                auVar36._56_4_ = (uint)bVar6 * auVar24._56_4_ | (uint)!bVar6 * auVar28._56_4_;
                auVar36._60_4_ =
                     (uint)(bVar11 >> 7) * auVar24._60_4_ |
                     (uint)!(bool)(bVar11 >> 7) * auVar28._60_4_;
                auVar23 = vextracti64x4_avx512f(auVar36,1);
                auVar24 = vpmulld_avx512f(auVar36,ZEXT3264(auVar23));
                auVar7 = vpmulld_avx(auVar24._0_16_,auVar24._16_16_);
                auVar8 = vpshufd_avx(auVar7,0xee);
                auVar7 = vpmulld_avx(auVar7,auVar8);
                auVar8 = vpshufd_avx(auVar7,0x55);
                auVar7 = vpmulld_avx(auVar7,auVar8);
                iVar38 = auVar7._0_4_;
              }
              local_70.
              super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
              .
              super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
              .m_data = fx->v + (uint)((int)(uVar17 % (ulong)uVar13) * iVar38);
              uVar13 = (fx->d).d[0];
              local_70.
              super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
              .
              super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
              .m_rows.m_value = (long)uVar13;
              uVar2 = (fx->d).d[1];
              if (uVar15 < 2) {
                uVar2 = 1;
              }
              local_70.
              super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
              .
              super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
              .m_cols.m_value = (long)uVar2;
              if ((uVar13 != uVar1) ||
                 (local_98.
                  super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                  .
                  super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                  .m_cols.m_value !=
                  local_70.
                  super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                  .
                  super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                  .m_cols.m_value)) goto LAB_0033bbab;
              Eigen::internal::
              generic_product_impl<Eigen::Map<Eigen::Matrix<float,-1,-1,0,-1,-1>,0,Eigen::Stride<0,0>>,Eigen::Map<Eigen::Matrix<float,-1,-1,0,-1,-1>,0,Eigen::Stride<0,0>>,Eigen::DenseShape,Eigen::DenseShape,8>
              ::addTo<Eigen::Map<Eigen::Matrix<float,_1,_1,0,_1,_1>,0,Eigen::Stride<0,0>>>
                        (&local_70,&local_b8,&local_98);
              uVar15 = (int)uVar17 + 1;
              uVar17 = (ulong)uVar15;
              uVar13 = (fx->d).bd;
              auVar24 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
              auVar25 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
            } while (uVar15 < uVar13);
          }
        }
        uVar14 = (ulong)((int)local_78 + 2);
        ppTVar12 = (xs->
                   super__Vector_base<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_>
                   )._M_impl.super__Vector_impl_data._M_start;
      } while (uVar14 < (ulong)((long)(xs->
                                      super__Vector_base<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_>
                                      )._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar12
                               >> 3));
    }
  }
  return;
}

Assistant:

void AffineTransform::forward_dev_impl(const MyDevice & dev, const vector<const Tensor*>& xs, Tensor& fx) const {
  assert(xs.size() % 2 == 1);
  if (xs.size() == 1) {
    fx.v = xs[0]->v;
    return;
  } else {
    // Add the first matrix
    if(fx.d.bd == xs[0]->d.bd) {
      fx.tvec().device(*dev.edevice) = xs[0]->tvec();
    } else {
      assert(xs[0]->d.bd == 1 && fx.d.bd != 1);
#ifdef __CUDACC__
      Eigen::array<int, 3> bcast; bcast[0] = bcast[1] = 1; bcast[2] = fx.d.bd;
      fx.tb<2>().device(*dev.edevice) = xs[0]->tb<2>().broadcast(bcast);
#else
      size_t batch_size = fx.d.batch_size();
      float *curr_ptr = fx.v, *end_ptr = curr_ptr + batch_size * fx.d.bd, *in_ptr = xs[0]->v;
      do {
        memcpy(curr_ptr, in_ptr, sizeof(float)*batch_size);
        curr_ptr += batch_size;
      } while(curr_ptr != end_ptr);
#endif
    }

    // Perform multiplication
#ifdef __CUDACC__
    for (unsigned i = 1; i < xs.size(); i += 2)
      // fx = (acc_sclar)*fx + xs[0] * xs[1]
      CUDAMatrixMultiply(dev, *xs[i], *xs[i + 1], fx, kSCALAR_ONE);
#else
    // Multiply
    for (unsigned i = 1; i < xs.size(); i += 2) {
      if(xs[i]->d.bd == 1 && xs[i+1]->d.bd == fx.d.bd) {
        fx.colbatch_matrix().noalias() += **xs[i] * xs[i+1]->colbatch_matrix();
      } else {
        assert(xs[i+1]->d.bd == 1 || xs[i+1]->d.bd == xs[i]->d.bd);
        for(unsigned b = 0; b < fx.d.bd; ++b) {
          fx.batch_matrix(b).noalias() += xs[i]->batch_matrix(b) * xs[i+1]->batch_matrix(b);
        }
      }
    }
#endif
  }
}